

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQClosure * __thiscall SQClosure::Clone(SQClosure *this)

{
  SQClosure *pSVar1;
  long in_RDI;
  SQInteger _n__1;
  SQInteger _n_;
  SQClosure *ret;
  SQFunctionProto *f;
  SQObjectPtr *in_stack_ffffffffffffffd8;
  byte *obj;
  SQWeakRef *in_stack_ffffffffffffffe0;
  byte *this_00;
  SQFunctionProto *in_stack_ffffffffffffffe8;
  SQSharedState *ss;
  
  ss = *(SQSharedState **)(in_RDI + 0x48);
  pSVar1 = Create(ss,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  pSVar1->_env = *(SQWeakRef **)(in_RDI + 0x30);
  if (pSVar1->_env != (SQWeakRef *)0x0) {
    (pSVar1->_env->super_SQRefCounted)._uiRef = (pSVar1->_env->super_SQRefCounted)._uiRef + 1;
  }
  for (this_00 = (byte *)0x0;
      (long)this_00 < (ss->_array_default_delegate).super_SQObject._unVal.nInteger;
      this_00 = (byte *)((long)&(((SQObjectPtr *)this_00)->super_SQObject)._type + 1)) {
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,in_stack_ffffffffffffffd8);
  }
  for (obj = (byte *)0x0; (long)obj < (ss->_string_default_delegate).super_SQObject._unVal.nInteger;
      obj = (byte *)((long)&(((SQObjectPtr *)obj)->super_SQObject)._type + 1)) {
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObjectPtr *)obj);
  }
  return pSVar1;
}

Assistant:

SQClosure *Clone()
    {
        SQFunctionProto *f = _function;
        SQClosure * ret = SQClosure::Create(_opt_ss(this),f,_root);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        _COPY_VECTOR(ret->_outervalues,_outervalues,f->_noutervalues);
        _COPY_VECTOR(ret->_defaultparams,_defaultparams,f->_ndefaultparams);
        return ret;
    }